

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O3

int LogL16Encode(TIFF *tif,uint8_t *bp,tmsize_t cc,uint16_t s)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  undefined6 in_register_0000000a;
  long lVar4;
  uint8_t *puVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  uint8_t *puVar14;
  long lVar15;
  bool bVar16;
  
  if ((int)CONCAT62(in_register_0000000a,s) != 0) {
    __assert_fail("s == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x1bf,"int LogL16Encode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  puVar5 = tif->tif_data;
  if (puVar5 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x1c0,"int LogL16Encode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  lVar2 = cc / (long)*(int *)(puVar5 + 0xc);
  puVar14 = bp;
  if (*(int *)(puVar5 + 4) != 1) {
    if (*(long *)(puVar5 + 0x18) < lVar2) {
      TIFFErrorExtR(tif,"LogL16Encode","Translation buffer too short");
      return 0;
    }
    puVar14 = *(uint8_t **)(puVar5 + 0x10);
    (**(code **)(puVar5 + 0x20))(puVar5,bp,lVar2);
  }
  lVar11 = tif->tif_rawdatasize - tif->tif_rawcc;
  puVar5 = tif->tif_rawcp;
  uVar8 = 0;
  iVar13 = 8;
  do {
    if (0 < lVar2) {
      bVar3 = (byte)iVar13;
      uVar12 = 0xff << (bVar3 & 0x1f);
      lVar15 = 0;
      do {
        if (lVar11 < 4) {
          tif->tif_rawcp = puVar5;
          tif->tif_rawcc = tif->tif_rawdatasize - lVar11;
          iVar1 = TIFFFlushData1(tif);
          if (iVar1 == 0) {
            return 0;
          }
          puVar5 = tif->tif_rawcp;
          lVar11 = tif->tif_rawdatasize - tif->tif_rawcc;
        }
        lVar6 = lVar15;
        lVar4 = lVar15;
        if (lVar15 < lVar2) {
          do {
            lVar6 = lVar4;
            uVar8 = 1;
            while ((lVar4 = lVar6 + uVar8, lVar4 < lVar2 &&
                   (((int)(short)*(ushort *)((long)(puVar14 + lVar6 * 2) + uVar8 * 2) & uVar12) ==
                    (int)(short)(*(ushort *)(puVar14 + lVar6 * 2) & (ushort)uVar12)))) {
              uVar8 = uVar8 + 1;
              if (uVar8 == 0x81) {
                uVar8 = 0x81;
                goto LAB_002a817a;
              }
            }
            if (3 < uVar8) goto LAB_002a817a;
          } while (lVar4 < lVar2);
          lVar6 = lVar6 + uVar8;
        }
LAB_002a817a:
        if ((lVar6 - lVar15 & 0xfffffffffffffffeU) != 2) {
joined_r0x002a81d9:
          do {
            lVar4 = lVar15;
            if (lVar6 <= lVar15) goto LAB_002a8281;
            lVar7 = lVar6 - lVar15;
            if (0x7e < lVar7) {
              lVar7 = 0x7f;
            }
            if (lVar11 < lVar7 + 3) {
              tif->tif_rawcp = puVar5;
              tif->tif_rawcc = tif->tif_rawdatasize - lVar11;
              iVar1 = TIFFFlushData1(tif);
              if (iVar1 == 0) {
                return 0;
              }
              puVar5 = tif->tif_rawcp;
              lVar11 = tif->tif_rawdatasize - tif->tif_rawcc;
            }
            *puVar5 = (uint8_t)lVar7;
            puVar5 = puVar5 + 1;
            lVar11 = lVar11 + -1;
            lVar10 = lVar7;
            lVar4 = lVar6;
            if (lVar6 == lVar15) goto LAB_002a8281;
            do {
              lVar4 = lVar15 * 2;
              lVar15 = lVar15 + 1;
              *puVar5 = (uint8_t)((int)*(short *)(puVar14 + lVar4) >> (bVar3 & 0x1f));
              puVar5 = puVar5 + 1;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
            lVar11 = lVar11 - lVar7;
          } while( true );
        }
        uVar9 = (uint)(short)(*(ushort *)(puVar14 + lVar15 * 2) & (ushort)uVar12);
        lVar4 = lVar15 + 1;
        do {
          if (((int)*(short *)(puVar14 + lVar4 * 2) & uVar12) != uVar9) goto joined_r0x002a81d9;
          lVar4 = lVar4 + 1;
        } while (lVar6 != lVar4);
        *puVar5 = ~(byte)lVar15 + (char)lVar6 + '\x7f';
        puVar5[1] = (uint8_t)(uVar9 >> (bVar3 & 0x1f));
        puVar5 = puVar5 + 2;
        lVar11 = lVar11 + -2;
        lVar4 = lVar6;
LAB_002a8281:
        if ((int)uVar8 < 4) {
          uVar8 = 0;
        }
        else {
          *puVar5 = (char)uVar8 + '~';
          puVar5[1] = (uint8_t)((int)*(short *)(puVar14 + lVar6 * 2) >> (bVar3 & 0x1f));
          puVar5 = puVar5 + 2;
          lVar11 = lVar11 + -2;
        }
        lVar15 = lVar4 + (uVar8 & 0xffffffff);
      } while (lVar15 < lVar2);
    }
    bVar16 = iVar13 == 0;
    iVar13 = iVar13 + -8;
    if (bVar16) {
      tif->tif_rawcp = puVar5;
      tif->tif_rawcc = tif->tif_rawdatasize - lVar11;
      return 1;
    }
  } while( true );
}

Assistant:

static int LogL16Encode(TIFF *tif, uint8_t *bp, tmsize_t cc, uint16_t s)
{
    static const char module[] = "LogL16Encode";
    LogLuvState *sp = EncoderState(tif);
    int shft;
    tmsize_t i;
    tmsize_t j;
    tmsize_t npixels;
    uint8_t *op;
    int16_t *tp;
    int16_t b;
    tmsize_t occ;
    int rc = 0, mask;
    tmsize_t beg;

    (void)s;
    assert(s == 0);
    assert(sp != NULL);
    npixels = cc / sp->pixel_size;

    if (sp->user_datafmt == SGILOGDATAFMT_16BIT)
        tp = (int16_t *)bp;
    else
    {
        tp = (int16_t *)sp->tbuf;
        if (sp->tbuflen < npixels)
        {
            TIFFErrorExtR(tif, module, "Translation buffer too short");
            return (0);
        }
        (*sp->tfunc)(sp, bp, npixels);
    }
    /* compress each byte string */
    op = tif->tif_rawcp;
    occ = tif->tif_rawdatasize - tif->tif_rawcc;
    for (shft = 8; shft >= 0; shft -= 8)
    {
        for (i = 0; i < npixels; i += rc)
        {
            if (occ < 4)
            {
                tif->tif_rawcp = op;
                tif->tif_rawcc = tif->tif_rawdatasize - occ;
                if (!TIFFFlushData1(tif))
                    return (0);
                op = tif->tif_rawcp;
                occ = tif->tif_rawdatasize - tif->tif_rawcc;
            }
            mask = 0xff << shft; /* find next run */
            for (beg = i; beg < npixels; beg += rc)
            {
                b = (int16_t)(tp[beg] & mask);
                rc = 1;
                while (rc < 127 + 2 && beg + rc < npixels &&
                       (tp[beg + rc] & mask) == b)
                    rc++;
                if (rc >= MINRUN)
                    break; /* long enough */
            }
            if (beg - i > 1 && beg - i < MINRUN)
            {
                b = (int16_t)(tp[i] & mask); /*check short run */
                j = i + 1;
                while ((tp[j++] & mask) == b)
                    if (j == beg)
                    {
                        *op++ = (uint8_t)(128 - 2 + j - i);
                        *op++ = (uint8_t)(b >> shft);
                        occ -= 2;
                        i = beg;
                        break;
                    }
            }
            while (i < beg)
            { /* write out non-run */
                if ((j = beg - i) > 127)
                    j = 127;
                if (occ < j + 3)
                {
                    tif->tif_rawcp = op;
                    tif->tif_rawcc = tif->tif_rawdatasize - occ;
                    if (!TIFFFlushData1(tif))
                        return (0);
                    op = tif->tif_rawcp;
                    occ = tif->tif_rawdatasize - tif->tif_rawcc;
                }
                *op++ = (uint8_t)j;
                occ--;
                while (j--)
                {
                    *op++ = (uint8_t)(tp[i++] >> shft & 0xff);
                    occ--;
                }
            }
            if (rc >= MINRUN)
            { /* write out run */
                *op++ = (uint8_t)(128 - 2 + rc);
                *op++ = (uint8_t)(tp[beg] >> shft & 0xff);
                occ -= 2;
            }
            else
                rc = 0;
        }
    }
    tif->tif_rawcp = op;
    tif->tif_rawcc = tif->tif_rawdatasize - occ;

    return (1);
}